

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O0

stStateUI * __thiscall TripleBuffer<stStateUI>::get(TripleBuffer<stStateUI> *this)

{
  stStateUI *psVar1;
  long in_RDI;
  lock_guard<std::mutex> lock;
  stStateUI *in_stack_ffffffffffffffc8;
  stStateUI *in_stack_ffffffffffffffd0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffd0,
             (mutex_type *)in_stack_ffffffffffffffc8);
  if ((*(byte *)(in_RDI + 0x228) & 1) != 0) {
    stStateUI::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    *(undefined1 *)(in_RDI + 0x228) = 0;
  }
  psVar1 = (stStateUI *)(in_RDI + 0x458);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b1ca1);
  return psVar1;
}

Assistant:

const T & get() {
        std::lock_guard<std::mutex> lock(mutex);
        if (hasChanged) {
            out = buffer;
            hasChanged = false;
        }

        return out;
    }